

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

void clear_bypasses(void)

{
  level *plVar1;
  monst *pmVar2;
  monst **ppmVar3;
  obj *poVar4;
  obj **ppoVar5;
  obj *poVar6;
  
  plVar1 = level;
  poVar6 = level->objlist;
  while (poVar4 = poVar6, poVar4 != (obj *)0x0) {
    poVar6 = poVar4->nobj;
    if ((*(uint *)&poVar4->field_0x4a >> 0x1a & 1) != 0) {
      *(uint *)&poVar4->field_0x4a = *(uint *)&poVar4->field_0x4a & 0xfbffffff;
    }
  }
  ppoVar5 = &magic_chest_objs;
  while (ppoVar5 = &((obj *)ppoVar5)->nobj->nobj, (obj *)ppoVar5 != (obj *)0x0) {
    ((obj *)ppoVar5)->field_0x4d = ((obj *)ppoVar5)->field_0x4d & 0xfb;
  }
  pmVar2 = (monst *)&plVar1->monlist;
  while (pmVar2 = pmVar2->nmon, pmVar2 != (monst *)0x0) {
    if (0 < pmVar2->mhp) {
      poVar6 = (obj *)&pmVar2->minvent;
      while (poVar6 = poVar6->nobj, poVar6 != (obj *)0x0) {
        poVar6->field_0x4d = poVar6->field_0x4d & 0xfb;
      }
    }
  }
  ppmVar3 = &migrating_mons;
  while (ppmVar3 = &((monst *)ppmVar3)->nmon->nmon, (monst *)ppmVar3 != (monst *)0x0) {
    poVar6 = (obj *)&((monst *)ppmVar3)->minvent;
    while (poVar6 = poVar6->nobj, poVar6 != (obj *)0x0) {
      poVar6->field_0x4d = poVar6->field_0x4d & 0xfb;
    }
  }
  flags.bypasses = '\0';
  return;
}

Assistant:

void clear_bypasses(void)
{
	struct obj *otmp, *nobj;
	struct monst *mtmp;

	for (otmp = level->objlist; otmp; otmp = nobj) {
	    nobj = otmp->nobj;
	    if (otmp->bypass) {
		otmp->bypass = 0;
		/* bypass will have inhibited any stacking, but since it's
		   used for polymorph handling, the objects here probably
		   have been transformed and won't be stacked in the usual
		   manner afterwards; so don't bother with this */
	    }
	}
	/* invent and mydogs chains shouldn't matter here */
	for (otmp = magic_chest_objs; otmp; otmp = otmp->nobj)
	    otmp->bypass = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	for (mtmp = migrating_mons; mtmp; mtmp = mtmp->nmon) {
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	flags.bypasses = FALSE;
}